

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O0

void __thiscall
writer_test_should_write_bool_field_Test::TestBody(writer_test_should_write_bool_field_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_> *field_00;
  size_t __n;
  AssertHelper local_250;
  Message local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_1;
  string local_208 [36];
  uint local_1e4;
  AssertHelper local_1e0;
  Message local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  ostringstream local_190 [8];
  ostringstream oss;
  bool local_13;
  Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_> local_12;
  writer_test_should_write_bool_field_Test *pwStack_10;
  Field field;
  writer_test_should_write_bool_field_Test *this_local;
  
  pwStack_10 = this;
  Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>::Field(&local_12);
  local_13 = true;
  Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>::set<bool>(&local_12,&local_13);
  std::__cxx11::ostringstream::ostringstream(local_190);
  Fixpp::writeField<Fixpp::Field<Fixpp::TagT<43u,Fixpp::Type::Boolean>>>
            ((Fixpp *)local_190,(ostream *)&local_12,field_00);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[6]>
            ((EqHelper<false> *)local_1b0,"oss.str()","\"43=Y|\"",&local_1d0,(char (*) [6])"43=Y|");
  std::__cxx11::string::~string((string *)&local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message(&local_1d8);
  }
  local_1e4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  if (local_1e4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_208,"",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
    std::__cxx11::ostringstream::str((string *)local_190);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
    gtest_ar_1.message_.ptr_._6_1_ = 0;
    Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>::set<bool>
              (&local_12,(bool *)((long)&gtest_ar_1.message_.ptr_ + 6));
    Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>_>::write
              ((int)local_190,&local_12,__n);
    std::__cxx11::ostringstream::str();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[6]>
              ((EqHelper<false> *)local_220,"oss.str()","\"43=N|\"",&local_240,(char (*) [6])"43=N|"
              );
    std::__cxx11::string::~string((string *)&local_240);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
    if (!bVar1) {
      testing::Message::Message(&local_248);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
      testing::internal::AssertHelper::AssertHelper
                (&local_250,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
                 ,0x50,pcVar2);
      testing::internal::AssertHelper::operator=(&local_250,&local_248);
      testing::internal::AssertHelper::~AssertHelper(&local_250);
      testing::Message::~Message(&local_248);
    }
    local_1e4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
    if (local_1e4 == 0) {
      local_1e4 = 0;
    }
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

TEST(writer_test, should_write_bool_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::PossDupFlag>;
    Field field;
    field.set(true);

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "43=Y|");

    oss.str("");

    field.set(false);
    Fixpp::details::FieldWriter<Field>::write(oss, field);

    ASSERT_EQ(oss.str(), "43=N|");
}